

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_MAAstarCluster.cpp
# Opt level: O0

bool __thiscall
GMAA_MAAstarCluster::ConstructAndValuateNextPolicies
          (GMAA_MAAstarCluster *this,PartialPolicyPoolItemInterface_sharedPtr *ppi,
          PartialPolicyPoolInterface_sharedPtr *poolOfNextPolicies,bool *cleanUpPPI)

{
  QFunctionJAOHInterface *q;
  pointer puVar1;
  bool bVar2;
  type pPVar3;
  type pPVar4;
  size_t sVar5;
  size_t sVar6;
  BayesianGameWithClusterInfo *this_00;
  ostream *poVar7;
  type pBVar8;
  type pJVar9;
  type pPVar10;
  undefined8 uVar11;
  BGIP_IncrementalSolverInterface *this_01;
  undefined1 *in_RCX;
  shared_ptr<PartialPolicyPoolInterface> *in_RDX;
  shared_ptr<PartialPolicyPoolItemInterface> *in_RSI;
  PlanningUnitDecPOMDPDiscrete *in_RDI;
  double dVar12;
  double dVar13;
  double extraout_XMM0_Qa;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar14 [16];
  undefined1 extraout_var [56];
  shared_ptr<BayesianGameIdenticalPayoffSolver> sVar16;
  stringstream ss_2;
  double oldValue;
  double newValue;
  double newPastreward;
  double discounted_F;
  double discountToThePowerT;
  JPPVfCBG_sharedPtr jpolBGcopy;
  double immR;
  JPPVfCBG_sharedPtr bgpol;
  bool foundCBGsolution;
  shared_ptr<JointPolicyDiscretePure> bgpol_jpdp;
  double val;
  JointPolicyPureVectorForClusteredBG bestLBjpolBG;
  stringstream ss;
  double pastReward_prevTs;
  stringstream ssAfter;
  stringstream ss_1;
  stringstream ssBefore;
  BGwCI_sharedPtr newBG;
  BGwCI_constPtr pBG;
  JPPVfCBG_sharedPtr pPcopy_1;
  PJPPV_sharedPtr pPcopy;
  JPPVfCBG_sharedPtr pJPolBG;
  shared_ptr<BayesianGameIdenticalPayoffSolver> bgipsNonIncremental;
  shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_> bgips;
  BGwCI_constPtr bg_ts;
  bool is_last_ts;
  Index ts;
  PJPDP_sharedPtr pP;
  BayesianGameIdenticalPayoffSolver *in_stack_ffffffffffffef98;
  undefined7 in_stack_ffffffffffffefa0;
  undefined1 in_stack_ffffffffffffefa7;
  byte bVar17;
  shared_ptr<const_BayesianGameWithClusterInfo> *in_stack_ffffffffffffefa8;
  BayesianGameBase *in_stack_ffffffffffffefb0;
  BayesianGameWithClusterInfo *in_stack_ffffffffffffefb8;
  shared_ptr<const_BayesianGameWithClusterInfo> *in_stack_ffffffffffffefc0;
  char *in_stack_ffffffffffffefc8;
  undefined7 in_stack_ffffffffffffefd0;
  undefined1 in_stack_ffffffffffffefd7;
  JointPolicyPureVectorForClusteredBG *in_stack_ffffffffffffeff8;
  shared_ptr<BayesianGameIdenticalPayoffSolver> *in_stack_fffffffffffff000;
  JPPVfCBG_constPtr *in_stack_fffffffffffff008;
  GeneralizedMAAStarPlannerForDecPOMDPDiscrete *in_stack_fffffffffffff010;
  PolicyDomainCategory idc;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> *in_stack_fffffffffffff018;
  JointPolicyPureVectorForClusteredBG *in_stack_fffffffffffff020;
  undefined7 in_stack_fffffffffffff0f8;
  undefined1 in_stack_fffffffffffff0ff;
  JointPolicyDiscretePure *in_stack_fffffffffffff100;
  BGwCI_constPtr *in_stack_fffffffffffff108;
  string *in_stack_fffffffffffff1e8;
  GMAA_MAAstarCluster *in_stack_fffffffffffff1f0;
  BayesianGameWithClusterInfo *in_stack_fffffffffffff270;
  string local_c20 [32];
  string local_c00 [32];
  stringstream local_be0 [16];
  ostream local_bd0 [376];
  double local_a58;
  shared_ptr<PartialJointPolicyDiscretePure> local_a48;
  undefined1 local_a38 [16];
  double local_a28;
  double local_a20;
  double local_a18;
  double local_a10;
  shared_ptr<JointPolicyPureVectorForClusteredBG> local_a08;
  shared_ptr<JointPolicyPureVectorForClusteredBG> local_9f8;
  shared_ptr<JointPolicyDiscretePure> local_9e0;
  double local_9d0;
  undefined1 local_9c8 [23];
  undefined1 local_9b1;
  double local_9a0;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> local_980 [11];
  string local_8c8 [35];
  char local_8a5;
  int local_8a4;
  stringstream local_8a0 [16];
  ostream local_890 [376];
  double local_718;
  string local_710 [80];
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [40];
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> local_688 [2];
  string local_668 [35];
  char local_645;
  int local_644;
  char local_63d;
  int local_63c;
  stringstream local_638 [16];
  ostream local_628 [380];
  undefined4 local_4ac;
  string local_4a8 [48];
  string local_478 [35];
  char local_455;
  int local_454;
  stringstream local_450 [16];
  ostream local_440 [376];
  string local_2c8 [35];
  char local_2a5;
  int local_2a4;
  char local_29d;
  int local_29c;
  stringstream local_298 [16];
  ostream local_288 [376];
  shared_ptr<BayesianGameWithClusterInfo> local_110 [4];
  undefined1 local_ca;
  shared_ptr<const_PartialJointPolicyDiscretePure> local_c8 [3];
  undefined1 local_98 [16];
  shared_ptr<JointPolicyPureVectorForClusteredBG> local_88 [2];
  shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_> local_68;
  shared_ptr<const_BayesianGameWithClusterInfo> local_58;
  byte local_45;
  uint local_34;
  shared_ptr<PartialJointPolicyDiscretePure> local_30;
  undefined1 *local_20;
  shared_ptr<PartialPolicyPoolInterface> *local_18;
  shared_ptr<PartialPolicyPoolItemInterface> *local_10;
  undefined1 auVar15 [64];
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pPVar3 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(in_RSI);
  (*pPVar3->_vptr_PartialPolicyPoolItemInterface[2])();
  pPVar4 = boost::shared_ptr<PartialJointPolicyDiscretePure>::operator->(&local_30);
  sVar5 = JointPolicy::GetDepth((JointPolicy *)pPVar4);
  local_34 = (uint)sVar5;
  sVar6 = PlanningUnit::GetHorizon((PlanningUnit *)in_RDI);
  local_45 = (sVar5 & 0xffffffff) == sVar6 - 1;
  boost::shared_ptr<const_BayesianGameWithClusterInfo>::shared_ptr
            ((shared_ptr<const_BayesianGameWithClusterInfo> *)0x96c26e);
  boost::shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_>::
  shared_ptr((shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_> *)
             0x96c27b);
  boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::shared_ptr
            ((shared_ptr<BayesianGameIdenticalPayoffSolver> *)0x96c288);
  boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::shared_ptr
            ((shared_ptr<JointPolicyPureVectorForClusteredBG> *)0x96c295);
  pPVar3 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(local_10);
  (*pPVar3->_vptr_PartialPolicyPoolItemInterface[5])(local_98);
  bVar2 = boost::operator==((shared_ptr<BayesianGameIdenticalPayoffSolver> *)
                            CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                            in_stack_ffffffffffffef98);
  boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::~shared_ptr
            ((shared_ptr<BayesianGameIdenticalPayoffSolver> *)0x96c2ec);
  if (bVar2) {
    if (7 < *(int *)&in_RDI[1].super_PlanningUnitMADPDiscrete._m_params._m_useSparseBeliefs) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "GMAA_MAAstarCluster: I have not expanded this ppi before...");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    in_RDI[1].super_PlanningUnitMADPDiscrete._m_nrObservationHistoriesT.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&((in_RDI[1].super_PlanningUnitMADPDiscrete._m_nrObservationHistoriesT.
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start + 1);
    if (local_34 == 0) {
      boost::shared_ptr<PartialJointPolicyDiscretePure>::operator*(&local_30);
      boost::make_shared<PartialJointPolicyPureVector,PartialJointPolicyDiscretePure&>
                ((PartialJointPolicyDiscretePure *)in_stack_ffffffffffffeff8);
      boost::shared_ptr<PartialJointPolicyDiscretePure>::operator=
                ((shared_ptr<PartialJointPolicyDiscretePure> *)in_stack_ffffffffffffefc0,
                 (shared_ptr<PartialJointPolicyPureVector> *)in_stack_ffffffffffffefb8);
      this_00 = (BayesianGameWithClusterInfo *)operator_new(0x1c8);
      local_ca = 1;
      q = (QFunctionJAOHInterface *)
          in_RDI[1].super_PlanningUnitMADPDiscrete._m_nrJointActionHistoriesT.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start;
      boost::shared_ptr<const_PartialJointPolicyDiscretePure>::
      shared_ptr<PartialJointPolicyDiscretePure>(local_c8,&local_30);
      BayesianGameWithClusterInfo::BayesianGameWithClusterInfo(this_00,in_RDI,q,local_c8,Lossless);
      local_ca = 0;
      boost::shared_ptr<BayesianGameWithClusterInfo>::shared_ptr<BayesianGameWithClusterInfo>
                ((shared_ptr<BayesianGameWithClusterInfo> *)in_stack_ffffffffffffefc0,
                 in_stack_ffffffffffffefb8);
      boost::shared_ptr<BayesianGameWithClusterInfo_const>::operator=
                (in_stack_ffffffffffffefc0,
                 (shared_ptr<BayesianGameWithClusterInfo> *)in_stack_ffffffffffffefb8);
      boost::shared_ptr<BayesianGameWithClusterInfo>::~shared_ptr
                ((shared_ptr<BayesianGameWithClusterInfo> *)0x96c49a);
      boost::shared_ptr<const_PartialJointPolicyDiscretePure>::~shared_ptr
                ((shared_ptr<const_PartialJointPolicyDiscretePure> *)0x96c4a7);
      boost::shared_ptr<PartialJointPolicyPureVector>::~shared_ptr
                ((shared_ptr<PartialJointPolicyPureVector> *)0x96c4b4);
    }
    else {
      boost::
      dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG,PartialJointPolicyDiscretePure>
                ((shared_ptr<PartialJointPolicyDiscretePure> *)in_stack_ffffffffffffefb8);
      boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::operator=
                ((shared_ptr<JointPolicyPureVectorForClusteredBG> *)in_stack_ffffffffffffefb0,
                 (shared_ptr<JointPolicyPureVectorForClusteredBG> *)in_stack_ffffffffffffefa8);
      boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::~shared_ptr
                ((shared_ptr<JointPolicyPureVectorForClusteredBG> *)0x96c559);
      bVar2 = boost::operator==((shared_ptr<JointPolicyPureVectorForClusteredBG> *)
                                CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                                in_stack_ffffffffffffef98);
      if (bVar2) {
        uVar11 = __cxa_allocate_exception(0x28);
        E::E((E *)CONCAT17(in_stack_ffffffffffffefd7,in_stack_ffffffffffffefd0),
             in_stack_ffffffffffffefc8);
        __cxa_throw(uVar11,&E::typeinfo,E::~E);
      }
      boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::operator*(local_88);
      boost::make_shared<JointPolicyPureVectorForClusteredBG,JointPolicyPureVectorForClusteredBG&>
                (in_stack_ffffffffffffeff8);
      boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::operator=
                ((shared_ptr<JointPolicyPureVectorForClusteredBG> *)in_stack_ffffffffffffefb0,
                 (shared_ptr<JointPolicyPureVectorForClusteredBG> *)in_stack_ffffffffffffefa8);
      boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::operator->(local_88);
      JointPolicyPureVectorForClusteredBG::GetBG
                ((JointPolicyPureVectorForClusteredBG *)in_stack_ffffffffffffef98);
      boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::operator*(local_88);
      BayesianGameWithClusterInfo::ConstructExtendedBGWCI
                (in_stack_fffffffffffff108,in_stack_fffffffffffff100,
                 (QFunctionJAOHInterface *)
                 CONCAT17(in_stack_fffffffffffff0ff,in_stack_fffffffffffff0f8));
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                              (char *)in_stack_ffffffffffffef98);
      if (bVar2) {
        std::__cxx11::stringstream::stringstream(local_298);
        poVar7 = std::operator<<(local_288,
                                 (string *)
                                 &in_RDI[1].super_PlanningUnitMADPDiscrete.
                                  _m_nrJointObservationHistoriesT);
        poVar7 = std::operator<<(poVar7,"beforeCluster");
        local_29c = (int)std::setw(6);
        poVar7 = std::operator<<(poVar7,(_Setw)local_29c);
        local_29d = (char)std::setfill<char>('0');
        poVar7 = std::operator<<(poVar7,local_29d);
        poVar7 = (ostream *)
                 std::ostream::operator<<
                           (poVar7,(ulong)in_RDI[1].super_PlanningUnitMADPDiscrete.
                                          _m_nrObservationHistoriesT.
                                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        poVar7 = std::operator<<(poVar7,"_ts");
        local_2a4 = (int)std::setw(3);
        poVar7 = std::operator<<(poVar7,(_Setw)local_2a4);
        local_2a5 = (char)std::setfill<char>('0');
        poVar7 = std::operator<<(poVar7,local_2a5);
        std::ostream::operator<<(poVar7,local_34);
        boost::shared_ptr<BayesianGameWithClusterInfo>::operator*(local_110);
        std::__cxx11::stringstream::str();
        BayesianGameIdenticalPayoff::Save
                  ((BayesianGameIdenticalPayoff *)
                   CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                   (string *)in_stack_ffffffffffffef98);
        std::__cxx11::string::~string(local_2c8);
        std::__cxx11::stringstream::~stringstream(local_298);
      }
      std::__cxx11::stringstream::stringstream(local_450);
      poVar7 = std::operator<<(local_440,"GMAA_MAAstarCluster::BGCluster_ts");
      local_454 = (int)std::setw(3);
      poVar7 = std::operator<<(poVar7,(_Setw)local_454);
      local_455 = (char)std::setfill<char>('0');
      poVar7 = std::operator<<(poVar7,local_455);
      std::ostream::operator<<(poVar7,local_34);
      std::__cxx11::stringstream::str();
      TimedAlgorithm::StartTimer
                ((TimedAlgorithm *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                 (string *)in_stack_ffffffffffffef98);
      std::__cxx11::string::~string(local_478);
      boost::shared_ptr<BayesianGameWithClusterInfo>::operator->(local_110);
      BayesianGameWithClusterInfo::Cluster(in_stack_fffffffffffff270);
      boost::shared_ptr<BayesianGameWithClusterInfo_const>::operator=
                (in_stack_ffffffffffffefc0,
                 (shared_ptr<BayesianGameWithClusterInfo> *)in_stack_ffffffffffffefb8);
      boost::shared_ptr<BayesianGameWithClusterInfo>::~shared_ptr
                ((shared_ptr<BayesianGameWithClusterInfo> *)0x96caf0);
      std::__cxx11::stringstream::str();
      TimedAlgorithm::StopTimer
                ((TimedAlgorithm *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                 (string *)in_stack_ffffffffffffef98);
      std::__cxx11::string::~string(local_4a8);
      std::__cxx11::stringstream::~stringstream(local_450);
      pBVar8 = boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->(&local_58);
      BayesianGameForDecPOMDPStageInterface::GetStage
                ((BayesianGameForDecPOMDPStageInterface *)pBVar8);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
           (size_type)in_stack_ffffffffffffef98);
      boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->(&local_58);
      sVar5 = BayesianGameBase::GetNrJointTypes(in_stack_ffffffffffffefb0);
      local_4ac = (undefined4)sVar5;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                 (value_type_conflict4 *)in_stack_ffffffffffffef98);
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                              (char *)in_stack_ffffffffffffef98);
      if (bVar2) {
        SaveClusterStats(in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8);
      }
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                              (char *)in_stack_ffffffffffffef98);
      if (bVar2) {
        std::__cxx11::stringstream::stringstream(local_638);
        poVar7 = std::operator<<(local_628,
                                 (string *)
                                 &in_RDI[1].super_PlanningUnitMADPDiscrete.
                                  _m_nrJointObservationHistoriesT);
        poVar7 = std::operator<<(poVar7,"afterCluster");
        local_63c = (int)std::setw(6);
        poVar7 = std::operator<<(poVar7,(_Setw)local_63c);
        local_63d = (char)std::setfill<char>('0');
        poVar7 = std::operator<<(poVar7,local_63d);
        poVar7 = (ostream *)
                 std::ostream::operator<<
                           (poVar7,(ulong)in_RDI[1].super_PlanningUnitMADPDiscrete.
                                          _m_nrObservationHistoriesT.
                                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        poVar7 = std::operator<<(poVar7,"_ts");
        local_644 = (int)std::setw(3);
        poVar7 = std::operator<<(poVar7,(_Setw)local_644);
        local_645 = (char)std::setfill<char>('0');
        poVar7 = std::operator<<(poVar7,local_645);
        std::ostream::operator<<(poVar7,local_34);
        boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator*(&local_58);
        std::__cxx11::stringstream::str();
        BayesianGameIdenticalPayoff::Save
                  ((BayesianGameIdenticalPayoff *)
                   CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                   (string *)in_stack_ffffffffffffef98);
        std::__cxx11::string::~string(local_668);
        std::__cxx11::stringstream::~stringstream(local_638);
      }
      boost::shared_ptr<BayesianGameWithClusterInfo>::~shared_ptr
                ((shared_ptr<BayesianGameWithClusterInfo> *)0x96cf6d);
      boost::shared_ptr<const_BayesianGameWithClusterInfo>::~shared_ptr
                ((shared_ptr<const_BayesianGameWithClusterInfo> *)0x96cf7a);
      boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::~shared_ptr
                ((shared_ptr<JointPolicyPureVectorForClusteredBG> *)0x96cf87);
    }
    puVar1 = in_RDI[1].super_PlanningUnitMADPDiscrete._m_nrJointActionHistoriesT.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    boost::shared_ptr<BayesianGameIdenticalPayoffInterface_const>::
    shared_ptr<BayesianGameWithClusterInfo_const>(local_688,&local_58);
    (**(code **)(*puVar1 + 0x10))(puVar1,local_688);
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::
    shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>>
              ((shared_ptr<BayesianGameIdenticalPayoffSolver> *)in_stack_ffffffffffffefc0,
               (BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG> *)
               in_stack_ffffffffffffefb8);
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::operator=
              ((shared_ptr<BayesianGameIdenticalPayoffSolver> *)in_stack_ffffffffffffefb0,
               (shared_ptr<BayesianGameIdenticalPayoffSolver> *)in_stack_ffffffffffffefa8);
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::~shared_ptr
              ((shared_ptr<BayesianGameIdenticalPayoffSolver> *)0x96d045);
    boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::~shared_ptr
              ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x96d052);
    boost::
    dynamic_pointer_cast<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>,BayesianGameIdenticalPayoffSolver>
              ((shared_ptr<BayesianGameIdenticalPayoffSolver> *)in_stack_ffffffffffffefb8);
    boost::shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_>::
    operator=((shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_> *
              )in_stack_ffffffffffffefb0,
              (shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_> *
              )in_stack_ffffffffffffefa8);
    boost::shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_>::
    ~shared_ptr((shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_>
                 *)0x96d089);
    bVar2 = boost::operator==((shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_>
                               *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                              in_stack_ffffffffffffef98);
    if (bVar2) {
      uVar11 = __cxa_allocate_exception(0x28);
      E::E((E *)CONCAT17(in_stack_ffffffffffffefd7,in_stack_ffffffffffffefd0),
           in_stack_ffffffffffffefc8);
      __cxa_throw(uVar11,&E::typeinfo,E::~E);
    }
    if ((local_45 & 1) == 0) {
      boost::shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_>::
      operator->(&local_68);
      sVar5 = BayesianGameIdenticalPayoffSolver::GetNrDesiredSolutions
                        ((BayesianGameIdenticalPayoffSolver *)0x96d193);
      if (sVar5 != 0x7fffffff) {
        uVar11 = __cxa_allocate_exception(0x28);
        E::E((E *)CONCAT17(in_stack_ffffffffffffefd7,in_stack_ffffffffffffefd0),
             in_stack_ffffffffffffefc8);
        __cxa_throw(uVar11,&E::typeinfo,E::~E);
      }
    }
    else {
      boost::shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_>::
      operator->(&local_68);
      BayesianGameIdenticalPayoffSolver::SetNrDesiredSolutions
                ((BayesianGameIdenticalPayoffSolver *)
                 CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                 (size_t)in_stack_ffffffffffffef98);
    }
    pPVar3 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(local_10);
    sVar16 = boost::
             static_pointer_cast<BayesianGameIdenticalPayoffSolver,BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>>
                       ((shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_>
                         *)in_stack_ffffffffffffefa8);
    (*pPVar3->_vptr_PartialPolicyPoolItemInterface[7])(pPVar3,local_6b0,sVar16.pn.pi_.pi_);
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::~shared_ptr
              ((shared_ptr<BayesianGameIdenticalPayoffSolver> *)0x96d277);
  }
  else {
    if (7 < *(int *)&in_RDI[1].super_PlanningUnitMADPDiscrete._m_params._m_useSparseBeliefs) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "GMAA_MAAstarCluster: ppi was expanded before, getting the previous BGIPSolver..."
                              );
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    pPVar3 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(local_10);
    (*pPVar3->_vptr_PartialPolicyPoolItemInterface[5])(local_6c0);
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::operator=
              ((shared_ptr<BayesianGameIdenticalPayoffSolver> *)in_stack_ffffffffffffefb0,
               (shared_ptr<BayesianGameIdenticalPayoffSolver> *)in_stack_ffffffffffffefa8);
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::~shared_ptr
              ((shared_ptr<BayesianGameIdenticalPayoffSolver> *)0x96d33c);
    boost::
    dynamic_pointer_cast<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>,BayesianGameIdenticalPayoffSolver>
              ((shared_ptr<BayesianGameIdenticalPayoffSolver> *)in_stack_ffffffffffffefb8);
    boost::shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_>::
    operator=((shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_> *
              )in_stack_ffffffffffffefb0,
              (shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_> *
              )in_stack_ffffffffffffefa8);
    boost::shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_>::
    ~shared_ptr((shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_>
                 *)0x96d373);
    bVar2 = boost::operator==((shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_>
                               *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                              in_stack_ffffffffffffef98);
    if (bVar2) {
      uVar11 = __cxa_allocate_exception(0x28);
      E::E((E *)CONCAT17(in_stack_ffffffffffffefd7,in_stack_ffffffffffffefd0),
           in_stack_ffffffffffffefc8);
      __cxa_throw(uVar11,&E::typeinfo,E::~E);
    }
    boost::shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_>::
    operator->(&local_68);
    BayesianGameIdenticalPayoffSolver::GetBGIPI(in_stack_ffffffffffffef98);
    boost::
    dynamic_pointer_cast<BayesianGameWithClusterInfo_const,BayesianGameIdenticalPayoffInterface_const>
              ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)in_stack_ffffffffffffefb8);
    boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator=
              ((shared_ptr<const_BayesianGameWithClusterInfo> *)in_stack_ffffffffffffefb0,
               in_stack_ffffffffffffefa8);
    boost::shared_ptr<const_BayesianGameWithClusterInfo>::~shared_ptr
              ((shared_ptr<const_BayesianGameWithClusterInfo> *)0x96d45b);
    boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::~shared_ptr
              ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x96d468);
    bVar2 = boost::operator==((shared_ptr<const_BayesianGameWithClusterInfo> *)
                              CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                              in_stack_ffffffffffffef98);
    if (bVar2) {
      uVar11 = __cxa_allocate_exception(0x28);
      E::E((E *)CONCAT17(in_stack_ffffffffffffefd7,in_stack_ffffffffffffefd0),
           in_stack_ffffffffffffefc8);
      __cxa_throw(uVar11,&E::typeinfo,E::~E);
    }
  }
  if (1 < *(int *)&in_RDI[1].super_PlanningUnitMADPDiscrete._m_params._m_useSparseBeliefs) {
    poVar7 = std::operator<<((ostream *)&std::cout,"About to solve the following BG:");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    pBVar8 = boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->(&local_58);
    (*(pBVar8->super_BayesianGameForDecPOMDPStage).super_BayesianGameForDecPOMDPStageInterface.
      _vptr_BayesianGameForDecPOMDPStageInterface[6])(local_710);
    poVar7 = std::operator<<((ostream *)&std::cout,local_710);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_710);
  }
  pPVar4 = boost::shared_ptr<PartialJointPolicyDiscretePure>::operator->(&local_30);
  local_718 = PartialJointPolicy::GetPastReward(&pPVar4->super_PartialJointPolicy);
  std::__cxx11::stringstream::stringstream(local_8a0);
  poVar7 = std::operator<<(local_890,"GMAA_MAAstarCluster::NextExact_ts");
  local_8a4 = (int)std::setw(3);
  poVar7 = std::operator<<(poVar7,(_Setw)local_8a4);
  local_8a5 = (char)std::setfill<char>('0');
  poVar7 = std::operator<<(poVar7,local_8a5);
  std::ostream::operator<<(poVar7,local_34);
  std::__cxx11::stringstream::str();
  TimedAlgorithm::StartTimer
            ((TimedAlgorithm *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
             (string *)in_stack_ffffffffffffef98);
  std::__cxx11::string::~string(local_8c8);
  auVar15._8_56_ = extraout_var;
  auVar15._0_8_ = extraout_XMM1_Qa;
  auVar14 = auVar15._0_16_;
  GeneralizedMAAStarPlannerForDecPOMDPDiscrete::SetCBGbounds
            (in_stack_fffffffffffff010,
             (shared_ptr<PartialPolicyPoolItemInterface> *)in_stack_fffffffffffff008,
             in_stack_fffffffffffff000);
  idc = (PolicyDomainCategory)((ulong)in_stack_fffffffffffff010 >> 0x20);
  boost::shared_ptr<BayesianGameIdenticalPayoffInterface_const>::
  shared_ptr<BayesianGameWithClusterInfo_const>(local_980,&local_58);
  boost::shared_ptr<const_JointPolicyPureVectorForClusteredBG>::shared_ptr
            ((shared_ptr<const_JointPolicyPureVectorForClusteredBG> *)0x96d779);
  dVar12 = 0.0;
  JointPolicyPureVectorForClusteredBG::JointPolicyPureVectorForClusteredBG
            (in_stack_fffffffffffff020,in_stack_fffffffffffff018,idc,in_stack_fffffffffffff008,
             (double)in_stack_fffffffffffff000);
  boost::shared_ptr<const_JointPolicyPureVectorForClusteredBG>::~shared_ptr
            ((shared_ptr<const_JointPolicyPureVectorForClusteredBG> *)0x96d7ab);
  boost::shared_ptr<const_BayesianGameIdenticalPayoffInterface>::~shared_ptr
            ((shared_ptr<const_BayesianGameIdenticalPayoffInterface> *)0x96d7b8);
  boost::shared_ptr<JointPolicyDiscretePure>::shared_ptr
            ((shared_ptr<JointPolicyDiscretePure> *)0x96d7c5);
  boost::shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_>::
  operator->(&local_68);
  local_9b1 = BGIP_IncrementalSolverInterface::GetNextJointPolicyAndValue
                        ((BGIP_IncrementalSolverInterface *)
                         CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                         (shared_ptr<JointPolicyDiscretePure> *)in_stack_ffffffffffffef98,
                         (double *)0x96d7f9);
  if ((bool)local_9b1) {
    boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG,JointPolicyDiscretePure>
              ((shared_ptr<JointPolicyDiscretePure> *)in_stack_ffffffffffffefb8);
    bVar2 = boost::operator==((shared_ptr<JointPolicyPureVectorForClusteredBG> *)
                              CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                              in_stack_ffffffffffffef98);
    if (bVar2) {
      uVar11 = __cxa_allocate_exception(0x28);
      E::E((E *)CONCAT17(in_stack_ffffffffffffefd7,in_stack_ffffffffffffefd0),
           in_stack_ffffffffffffefc8);
      __cxa_throw(uVar11,&E::typeinfo,E::~E);
    }
    pBVar8 = boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->(&local_58);
    boost::shared_ptr<JointPolicyDiscretePure>::shared_ptr<JointPolicyPureVectorForClusteredBG>
              (&local_9e0,local_9c8);
    (*(pBVar8->super_BayesianGameForDecPOMDPStage).super_BayesianGameForDecPOMDPStageInterface.
      _vptr_BayesianGameForDecPOMDPStageInterface[5])(pBVar8,&local_9e0,0);
    boost::shared_ptr<JointPolicyDiscretePure>::~shared_ptr
              ((shared_ptr<JointPolicyDiscretePure> *)0x96d9c8);
    local_9d0 = dVar12;
    boost::
    dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG,JointPolicyPureVectorForClusteredBG>
              ((shared_ptr<JointPolicyPureVectorForClusteredBG> *)in_stack_ffffffffffffefa8);
    boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::operator*(&local_a08);
    boost::make_shared<JointPolicyPureVectorForClusteredBG,JointPolicyPureVectorForClusteredBG&>
              (in_stack_ffffffffffffeff8);
    boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::~shared_ptr
              ((shared_ptr<JointPolicyPureVectorForClusteredBG> *)0x96da32);
    pJVar9 = boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::operator->(&local_9f8);
    (*(pJVar9->super_PartialJointPolicyPureVector).super_PartialJointPolicyDiscretePure.
      super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy._vptr_JointPolicy[2]
    )(pJVar9,(ulong)(local_34 + 1));
    dVar12 = PlanningUnitDecPOMDPDiscrete::GetDiscount((PlanningUnitDecPOMDPDiscrete *)0x96da74);
    auVar14 = vcvtusi2sd_avx512f(auVar14,local_34);
    local_a10 = pow(dVar12,auVar14._0_8_);
    local_a18 = local_a10 * local_9a0;
    local_a20 = local_718 + local_9d0;
    pJVar9 = boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::operator->(&local_9f8);
    PartialJointPolicy::SetPastReward
              (&(pJVar9->super_PartialJointPolicyPureVector).super_PartialJointPolicyDiscretePure.
                super_PartialJointPolicy,local_a20);
    if ((local_45 & 1) == 0) {
      local_a28 = local_718 + local_a18;
    }
    else {
      local_a28 = local_a20;
    }
    pPVar10 = boost::shared_ptr<PartialPolicyPoolInterface>::operator->(local_18);
    boost::shared_ptr<PartialJointPolicyDiscretePure>::
    shared_ptr<JointPolicyPureVectorForClusteredBG>(&local_a48,&local_9f8);
    dVar12 = local_a28;
    (*(in_RDI->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[0x16])
              (local_a38,in_RDI,&local_a48);
    (*pPVar10->_vptr_PartialPolicyPoolInterface[8])(pPVar10,local_a38);
    boost::shared_ptr<PartialPolicyPoolItemInterface>::~shared_ptr
              ((shared_ptr<PartialPolicyPoolItemInterface> *)0x96dc3e);
    boost::shared_ptr<PartialJointPolicyDiscretePure>::~shared_ptr
              ((shared_ptr<PartialJointPolicyDiscretePure> *)0x96dc4b);
    if (local_34 != 0) {
      pPVar3 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(local_10);
      (*pPVar3->_vptr_PartialPolicyPoolItemInterface[3])();
      local_a58 = dVar12;
      pPVar3 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(local_10);
      (*pPVar3->_vptr_PartialPolicyPoolItemInterface[4])(local_a28);
      dVar13 = PlanningUnitDecPOMDPDiscrete::GetDiscount((PlanningUnitDecPOMDPDiscrete *)0x96dcde);
      dVar12 = local_a58;
      if ((dVar13 == 1.0) && (!NAN(dVar13))) {
        dVar13 = local_a58;
        pPVar3 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(local_10);
        (*pPVar3->_vptr_PartialPolicyPoolItemInterface[3])();
        if (dVar12 < dVar13) {
          pPVar3 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(local_10);
          (*pPVar3->_vptr_PartialPolicyPoolItemInterface[3])();
          bVar2 = Globals::EqualReward
                            ((double)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                             (double)in_stack_ffffffffffffef98);
          if (!bVar2) {
            std::__cxx11::stringstream::stringstream(local_be0);
            poVar7 = std::operator<<(local_bd0,
                                     "GMAA_MAAstarCluster value of parent can only go down when being updated: old value="
                                    );
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_a58);
            dVar12 = extraout_XMM0_Qa;
            poVar7 = std::operator<<(poVar7," new value=");
            pPVar3 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(local_10);
            (*pPVar3->_vptr_PartialPolicyPoolItemInterface[3])();
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,dVar12);
            poVar7 = std::operator<<(poVar7," old-new=");
            dVar12 = local_a58;
            dVar13 = local_a58;
            pPVar3 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(local_10);
            (*pPVar3->_vptr_PartialPolicyPoolItemInterface[3])();
            std::ostream::operator<<(poVar7,dVar13 - dVar12);
            uVar11 = __cxa_allocate_exception(0x28);
            E::E((E *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
                 (stringstream *)in_stack_ffffffffffffef98);
            __cxa_throw(uVar11,&E::typeinfo,E::~E);
          }
        }
      }
    }
    boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::~shared_ptr
              ((shared_ptr<JointPolicyPureVectorForClusteredBG> *)0x96dfe8);
    boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::~shared_ptr
              ((shared_ptr<JointPolicyPureVectorForClusteredBG> *)0x96dff5);
  }
  else {
    if (0 < *(int *)&in_RDI[1].super_PlanningUnitMADPDiscrete._m_params._m_useSparseBeliefs) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "GMAA_MAAstar no valid solution returned by the Incremental BGIP Solver"
                              );
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    pPVar3 = boost::shared_ptr<PartialPolicyPoolItemInterface>::operator->(local_10);
    (*pPVar3->_vptr_PartialPolicyPoolItemInterface[4])(0xffefffffffffffff);
  }
  this_01 = (BGIP_IncrementalSolverInterface *)
            boost::
            shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_>::
            operator->(&local_68);
  bVar2 = BGIP_IncrementalSolverInterface::AllSolutionsHaveBeenReturned(this_01);
  if (bVar2) {
    if (3 < *(int *)&in_RDI[1].super_PlanningUnitMADPDiscrete._m_params._m_useSparseBeliefs) {
      poVar7 = std::operator<<((ostream *)&std::cout,">>>AllSolutionsHaveBeenReturned, removing ");
      pPVar4 = boost::shared_ptr<PartialJointPolicyDiscretePure>::operator->(&local_30);
      (*(pPVar4->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
        _vptr_JointPolicy[6])(local_c00);
      poVar7 = std::operator<<(poVar7,local_c00);
      poVar7 = std::operator<<(poVar7,"<<<");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_c00);
    }
    *local_20 = 1;
  }
  else {
    *local_20 = 0;
  }
  std::__cxx11::stringstream::str();
  TimedAlgorithm::StopTimer
            ((TimedAlgorithm *)CONCAT17(in_stack_ffffffffffffefa7,in_stack_ffffffffffffefa0),
             (string *)in_stack_ffffffffffffef98);
  std::__cxx11::string::~string(local_c20);
  bVar17 = local_45;
  boost::shared_ptr<JointPolicyDiscretePure>::~shared_ptr
            ((shared_ptr<JointPolicyDiscretePure> *)0x96e207);
  JointPolicyPureVectorForClusteredBG::~JointPolicyPureVectorForClusteredBG
            ((JointPolicyPureVectorForClusteredBG *)CONCAT17(bVar17,in_stack_ffffffffffffefa0));
  std::__cxx11::stringstream::~stringstream(local_8a0);
  boost::shared_ptr<JointPolicyPureVectorForClusteredBG>::~shared_ptr
            ((shared_ptr<JointPolicyPureVectorForClusteredBG> *)0x96e22e);
  boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::~shared_ptr
            ((shared_ptr<BayesianGameIdenticalPayoffSolver> *)0x96e23b);
  boost::shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_>::
  ~shared_ptr((shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>_> *
              )0x96e248);
  boost::shared_ptr<const_BayesianGameWithClusterInfo>::~shared_ptr
            ((shared_ptr<const_BayesianGameWithClusterInfo> *)0x96e255);
  boost::shared_ptr<PartialJointPolicyDiscretePure>::~shared_ptr
            ((shared_ptr<PartialJointPolicyDiscretePure> *)0x96e262);
  return (bool)(bVar17 & 1);
}

Assistant:

bool GMAA_MAAstarCluster::ConstructAndValuateNextPolicies(
        const PartialPolicyPoolItemInterface_sharedPtr &ppi,
        const PartialPolicyPoolInterface_sharedPtr &poolOfNextPolicies,
        bool &cleanUpPPI)
{
    PJPDP_sharedPtr pP = ppi->GetJPol();
    Index ts = pP->GetDepth();
    bool is_last_ts = (ts ==  GetHorizon() - 1);

    BGwCI_constPtr bg_ts;
    boost::shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG> > bgips;
    //boost::shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVectorForClusteredBG> > bgipsNonIncremental;
    boost::shared_ptr<BayesianGameIdenticalPayoffSolver> bgipsNonIncremental;

    JPPVfCBG_sharedPtr pJPolBG;

    if(ppi->GetBGIPSolverPointer()==0)
    {
        if(_m_verboseness >= 8) 
            cout << "GMAA_MAAstarCluster: I have not expanded this ppi before..." << endl;

        _m_bgCounter++;
        if(ts == 0)
        {
            //first stage, build BG from scratch.
            //also here we need to store the past policy
            PJPPV_sharedPtr pPcopy = boost::make_shared<PartialJointPolicyPureVector>(*pP);
            pP = pPcopy;

// Apparently make_shared works differently on Ubuntu 11.10, so call shared_ptr directly
//            bg_ts = boost::make_shared<BayesianGameWithClusterInfo>(this, _m_qHeuristic, pP);
            bg_ts = boost::shared_ptr<BayesianGameWithClusterInfo>(new BayesianGameWithClusterInfo(this, _m_qHeuristic, pP));
        }
        else
        {
            pJPolBG = 
                boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG>(pP);
            if(pJPolBG == 0)
                throw E("GMAA_MAAstarCluster::ConstructAndValuateNextPolicies - dynamic cast failed!"); 
            
            //when this function returns, ppi and the policy pointed to will be 
            //deleted by GeneralizedMAAStarPlannerForDecPOMDPDiscrete.
            //However, we need to preserve the past (bg) policy to reconstruct the
            //final policy!
            //As a solution, we make an actual copy here.
            JPPVfCBG_sharedPtr pPcopy = boost::make_shared<JointPolicyPureVectorForClusteredBG>(*pJPolBG);
            pJPolBG = pPcopy;

            BGwCI_constPtr pBG = pJPolBG->GetBG();
            BGwCI_sharedPtr newBG = 
                BayesianGameWithClusterInfo::ConstructExtendedBGWCI(pBG,*pJPolBG, _m_qHeuristic);
            
            if(_m_bgBaseFilename!="")
            {
                stringstream ssBefore;
                ssBefore << _m_bgBaseFilename << "beforeCluster"
                         << setw(6) << setfill('0')
                         << _m_bgCounter << "_ts"
                         << setw(3) << setfill('0') << ts;
                BayesianGameIdenticalPayoff::Save(*newBG,ssBefore.str());
            }

            {
                stringstream ss;
                ss << "GMAA_MAAstarCluster::BGCluster_ts" 
                   << setw(3) << setfill('0') << ts;
                StartTimer(ss.str());
                // do the clustering
                bg_ts = newBG->Cluster();
                StopTimer(ss.str());
            }

            _m_clusteredBGsizes.at(
                bg_ts->GetStage()).push_back(bg_ts->GetNrJointTypes());
            if(_m_clusterStatsFilename!="")
                SaveClusterStats(_m_clusterStatsFilename);
        
            if(_m_bgBaseFilename!="")
            {
                stringstream ssAfter;
                ssAfter << _m_bgBaseFilename << "afterCluster"
                         << setw(6) << setfill('0')
                         << _m_bgCounter << "_ts"
                         << setw(3) << setfill('0') << ts;
                BayesianGameIdenticalPayoff::Save(*bg_ts,ssAfter.str());
            }
        }

        // keep track of every bg_ts we instantiate, so we can clean
        // them up after solving
//        _m_pointersToAllBGTS.push_back(bg_ts);

        // create the BGIPSolver
        // _m_newBGIP_Solver is pointer to a BGSolverCreator, here this functor is called:
        bgipsNonIncremental =
            boost::shared_ptr<BayesianGameIdenticalPayoffSolver >(
                    _m_newBGIP_Solver->operator()(bg_ts) );

        //check if it can be converted to an incremental solver:
        bgips = 
            boost::dynamic_pointer_cast<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG> > (bgipsNonIncremental);

        if(bgips==0)
            throw(E("GMAA_MAAstarCluster requires BGIP_IncrementalSolverInterface_T solvers"));
        if(is_last_ts)
        {
            //For the last stage we only want 1 solution.
            bgips->SetNrDesiredSolutions(1);
        }
        else if(bgips->GetNrDesiredSolutions()!=INT_MAX)
            throw(E("GMAA_MAAstar requires a BGIP solver to return all solutions (when requested)"));

        // associate the resulting incremental BGIPSolver with this
        // PPI, so that we can reuse it
        //ppi->SetBGIPSolver_T_Pointer(bgips);
        ppi->SetBGIPSolverPointer( boost::static_pointer_cast<BayesianGameIdenticalPayoffSolver>(bgips) );
    }
    else // we already have the solver:
    {
        if(_m_verboseness >= 8) 
            cout << "GMAA_MAAstarCluster: ppi was expanded before, getting the previous BGIPSolver..." << endl;

        //bgipsNonIncremental=ppi->GetBGIPSolver_T_PointerCluster();
        bgipsNonIncremental = ppi->GetBGIPSolverPointer();
        bgips = boost::dynamic_pointer_cast<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG> >(bgipsNonIncremental);
        if(bgips == 0)
            throw(E("GMAA_MAAstarCluster requires BGIP_IncrementalSolverInterface_T solvers"));
        bg_ts = boost::dynamic_pointer_cast<const BayesianGameWithClusterInfo>(bgips->GetBGIPI());
        if(bg_ts == 0)
            throw(E("GMAA_MAAstarCluster BG is not of the correct type"));
    }

    if(_m_verboseness >= 2) {
        cout << "About to solve the following BG:"<< endl;
        cout << bg_ts->SoftPrint() << endl;
    }

    double pastReward_prevTs = pP->GetPastReward();

    stringstream ss;
    ss << "GMAA_MAAstarCluster::NextExact_ts" << setw(3) << setfill('0') << ts;
    StartTimer(ss.str());
    
    // Compute bounds on the value solving this CBG can result in
    SetCBGbounds(ppi,bgipsNonIncremental);

    // a copy, which is only used for the last stage
    JointPolicyPureVectorForClusteredBG bestLBjpolBG = 
        JointPolicyPureVectorForClusteredBG(bg_ts);

    // Ask the BGIPSolver for the next solution, which might not exist
    // due to the bounds on the value of the solution
    double val;
    boost::shared_ptr<JointPolicyDiscretePure> bgpol_jpdp;
    /// Calling the BGIPSolver
    bool foundCBGsolution = bgips->GetNextJointPolicyAndValue(bgpol_jpdp, val);

    if(foundCBGsolution)
    {
        JPPVfCBG_sharedPtr bgpol = boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG>(bgpol_jpdp);
        if(bgpol==0)
            throw(E("GMAA_MAAstarCluster: did not get a valid policy from the incremental BGIP solver"));
        double immR = bg_ts->ComputeDiscountedImmediateRewardForJPol(bgpol);
        
        JPPVfCBG_sharedPtr jpolBGcopy = boost::make_shared<JointPolicyPureVectorForClusteredBG>(*boost::dynamic_pointer_cast<JointPolicyPureVectorForClusteredBG>(bgpol));
        jpolBGcopy->SetDepth(ts+1);

        double discountToThePowerT = pow( GetDiscount(), (double)(ts) );
        double discounted_F = discountToThePowerT * val;

        //compute expected immediate reward for this stage
        double newPastreward = pastReward_prevTs + immR;
        jpolBGcopy->SetPastReward(newPastreward);
        
        //push this policy and value on the priority queue
        ////if last stage, if so, we want to return the 
        ////*EXACT* past reward, newPastreward.
        double newValue;
        if(is_last_ts)
            newValue=newPastreward;
        else
            newValue=pastReward_prevTs + discounted_F;

        poolOfNextPolicies->Insert( NewPPI(jpolBGcopy,newValue) );

        if(ts>0)
        {
            double oldValue=ppi->GetValue();
            // now we update the current PPI with the value of the next sibling
            // other option is the value of this child
//        ppi->SetValue(bgips->GetPayoff());
            ppi->SetValue(newValue);//-(1e-10));

            if(GetDiscount()==1.0 &&
               oldValue < ppi->GetValue() &&
               !EqualReward(oldValue, ppi->GetValue()))
            {
                stringstream ss;
                ss << "GMAA_MAAstarCluster value of parent can only go down when being updated: old value="
                   << oldValue << " new value=" << ppi->GetValue()
                   << " old-new=" << oldValue-ppi->GetValue();
                throw(E(ss));
            }
        }
    }
    else // we did NOT get a valid solution from this CBG
    {
        if(_m_verboseness >= 1)
            cout << "GMAA_MAAstar no valid solution returned by the Incremental BGIP Solver"<< endl;

        // as we didn't any solution for the CBG, we know this branch
        // of the tree can never contain the optimal policy, so we set
        // its value very low
        ppi->SetValue(-DBL_MAX);
    }

    // if we returned all solutions from this BG, it has to be deleted
    // from the policy pool
    if(bgips->AllSolutionsHaveBeenReturned())
    {
        if(_m_verboseness >= 4)
            cout << ">>>AllSolutionsHaveBeenReturned, removing " << pP->SoftPrint()
                 << "<<<"<<endl;
        cleanUpPPI=true;
    }
    else
        cleanUpPPI=false;

    StopTimer(ss.str());
    //if we created a BG for the last time step t=h-1 - we have a lowerbound
    return(is_last_ts);
}